

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<float,_10>::TPZManVector(TPZManVector<float,_10> *this,TPZVec<float> *copy)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  
  (this->super_TPZVec<float>).fStore = (float *)0x0;
  (this->super_TPZVec<float>).fNElements = 0;
  (this->super_TPZVec<float>).fNAlloc = 0;
  (this->super_TPZVec<float>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841c20;
  uVar1 = copy->fNElements;
  if ((long)uVar1 < 0xb) {
    pfVar3 = this->fExtAlloc;
    uVar4 = 0;
  }
  else {
    pfVar3 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    uVar4 = uVar1;
  }
  (this->super_TPZVec<float>).fStore = pfVar3;
  (this->super_TPZVec<float>).fNElements = uVar1;
  (this->super_TPZVec<float>).fNAlloc = uVar4;
  if (0 < (long)uVar1) {
    pfVar3 = copy->fStore;
    pfVar2 = (this->super_TPZVec<float>).fStore;
    uVar4 = 0;
    do {
      pfVar2[uVar4] = pfVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}